

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNQOut.cpp
# Opt level: O0

void __thiscall NaPNQueueOutput::get_data(NaPNQueueOutput *this,NaReal *pPortion)

{
  uint uVar1;
  NaVector *pNVar2;
  long in_RSI;
  NaVector *in_RDI;
  NaReal NVar3;
  uint i;
  uint in_stack_ffffffffffffffbc;
  NaVector *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  uint in_stack_ffffffffffffffdc;
  uint local_14;
  
  if (in_RSI != 0) {
    local_14 = 0;
    while( true ) {
      in_stack_ffffffffffffffdc = local_14;
      pNVar2 = NaPetriCnInput::data
                         ((NaPetriCnInput *)
                          CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      uVar1 = (*pNVar2->_vptr_NaVector[6])();
      if (uVar1 <= in_stack_ffffffffffffffdc) break;
      NVar3 = NaVector::operator()(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
      *(NaReal *)(in_RSI + (ulong)local_14 * 8) = NVar3;
      local_14 = local_14 + 1;
    }
  }
  if (*(int *)&in_RDI[7]._vptr_NaVector != 0) {
    (*in_RDI->_vptr_NaVector[0x15])();
    NaVector::shift(in_RDI,in_stack_ffffffffffffffdc);
    NaVector::dim(in_RDI + 6);
    (*in_RDI->_vptr_NaVector[0x15])();
    NaVector::new_dim(in_RDI,in_stack_ffffffffffffffdc);
  }
  return;
}

Assistant:

void
NaPNQueueOutput::get_data (NaReal* pPortion)
{
  unsigned	i;

  if(NULL != pPortion){
    // Get data from the queue
    for(i = 0; i < in.data().dim(); ++i){
      pPortion[i] = vQueue(i);
    }
  }
  // else
  //   remove

  if(nQLimit > 0){
    // Remove data portion
    vQueue.shift(- (int)get_data_dim());
    vQueue.new_dim(vQueue.dim() - get_data_dim());
  }
}